

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenTableAccessor
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  GenReceiver(this,struct_def,code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenTableAccessor(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    GenReceiver(struct_def, code_ptr);
    code += " Table() flatbuffers.Table ";
    code += "{\n";

    if (struct_def.fixed) {
      code += "\treturn rcv._tab.Table\n";
    } else {
      code += "\treturn rcv._tab\n";
    }
    code += "}\n\n";
  }